

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::MergeFrom
          (TreeEnsembleClassifier *this,TreeEnsembleClassifier *from)

{
  LogMessage *other;
  TreeEnsembleParameters *this_00;
  StringVector *this_01;
  Int64Vector *this_02;
  undefined1 *puVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x5bc);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if ((from != (TreeEnsembleClassifier *)_TreeEnsembleClassifier_default_instance_) &&
     (from->treeensemble_ != (TreeEnsembleParameters *)0x0)) {
    this_00 = _internal_mutable_treeensemble(this);
    puVar1 = (undefined1 *)from->treeensemble_;
    if ((TreeEnsembleParameters *)puVar1 == (TreeEnsembleParameters *)0x0) {
      puVar1 = _TreeEnsembleParameters_default_instance_;
    }
    TreeEnsembleParameters::MergeFrom(this_00,(TreeEnsembleParameters *)puVar1);
  }
  if (from->postevaluationtransform_ != 0) {
    this->postevaluationtransform_ = from->postevaluationtransform_;
  }
  if (from->_oneof_case_[0] == 0x65) {
    this_02 = _internal_mutable_int64classlabels(this);
    if (from->_oneof_case_[0] == 0x65) {
      puVar1 = (undefined1 *)(from->ClassLabels_).int64classlabels_;
    }
    else {
      puVar1 = _Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom(this_02,(Int64Vector *)puVar1);
  }
  else if (from->_oneof_case_[0] == 100) {
    this_01 = _internal_mutable_stringclasslabels(this);
    if (from->_oneof_case_[0] == 100) {
      puVar1 = (undefined1 *)(from->ClassLabels_).stringclasslabels_;
    }
    else {
      puVar1 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom(this_01,(StringVector *)puVar1);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void TreeEnsembleClassifier::MergeFrom(const TreeEnsembleClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.TreeEnsembleClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_has_treeensemble()) {
    _internal_mutable_treeensemble()->::CoreML::Specification::TreeEnsembleParameters::MergeFrom(from._internal_treeensemble());
  }
  if (from._internal_postevaluationtransform() != 0) {
    _internal_set_postevaluationtransform(from._internal_postevaluationtransform());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      _internal_mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      _internal_mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}